

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmbtoken.cc
# Opt level: O0

int cbb_add_prefixed_point(CBB *out,EC_GROUP *group,EC_AFFINE *point,int prefix_point)

{
  int iVar1;
  undefined1 local_60 [8];
  CBB child;
  int prefix_point_local;
  EC_AFFINE *point_local;
  EC_GROUP *group_local;
  CBB *out_local;
  
  child.u._28_4_ = prefix_point;
  if (prefix_point == 0) {
    iVar1 = point_to_cbb(out,group,point);
    if ((iVar1 == 0) || (iVar1 = CBB_flush(out), iVar1 == 0)) {
      return 0;
    }
  }
  else {
    iVar1 = CBB_add_u16_length_prefixed(out,(CBB *)local_60);
    if (((iVar1 == 0) || (iVar1 = point_to_cbb((CBB *)local_60,group,point), iVar1 == 0)) ||
       (iVar1 = CBB_flush(out), iVar1 == 0)) {
      return 0;
    }
  }
  return 1;
}

Assistant:

static int cbb_add_prefixed_point(CBB *out, const EC_GROUP *group,
                                  const EC_AFFINE *point, int prefix_point) {
  if (prefix_point) {
    CBB child;
    if (!CBB_add_u16_length_prefixed(out, &child) ||
        !point_to_cbb(&child, group, point) || !CBB_flush(out)) {
      return 0;
    }
  } else {
    if (!point_to_cbb(out, group, point) || !CBB_flush(out)) {
      return 0;
    }
  }

  return 1;
}